

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O2

void gen_evmwsmi(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o_1;
  uintptr_t o;
  
  if (ctx->spe_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_mov_i64_ppc64(tcg_ctx,ret,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
    tcg_gen_ext32s_i64_ppc64(tcg_ctx,ret,ret);
    tcg_gen_mov_i64_ppc64
              (tcg_ctx,ret_00,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)));
    tcg_gen_ext32s_i64_ppc64(tcg_ctx,ret_00,ret_00);
    tcg_gen_mul_i64_ppc64(tcg_ctx,ret,ret,ret_00);
    gen_store_gpr64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,ret);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x20);
  return;
}

Assistant:

static inline void gen_evmwsmi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0, t1;

    if (unlikely(!ctx->spe_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_SPEU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);

    /* t0 := rA; t1 := rB */
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t0, t0);
    tcg_gen_extu_tl_i64(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_ext32s_i64(tcg_ctx, t1, t1);

    tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);  /* t0 := rA * rB */

    gen_store_gpr64(tcg_ctx, rD(ctx->opcode), t0); /* rD := t0 */

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}